

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O2

Pixmap __thiscall
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image
          (Am_Image_Array_Data *this,Am_Drawonable_Impl *draw,XColor **cols,int *n_cols)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  Am_RGB_Value *pAVar5;
  Am_Generic_Image *pAVar6;
  Screen_Desc *pSVar7;
  Display *pDVar8;
  undefined8 uVar9;
  XColor *pXVar10;
  void *pvVar11;
  undefined4 *puVar12;
  Pixmap PVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  unsigned_short *puVar21;
  uchar *puVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar25;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uVar26;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar27;
  
  pAVar5 = this->image_->color_map;
  iVar4 = (this->image_->iminfo).num_colors;
  uVar14 = (ulong)iVar4;
  *n_cols = iVar4;
  uVar18 = 0xffffffffffffffff;
  if (-1 < (long)uVar14) {
    uVar18 = uVar14 << 4;
  }
  pXVar10 = (XColor *)operator_new__(uVar18);
  *cols = pXVar10;
  puVar21 = &pAVar5->blue;
  lVar16 = 0;
  lVar23 = 0;
  while( true ) {
    uVar27 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    uVar26 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    if ((int)uVar14 <= lVar23) break;
    pXVar10 = *cols;
    uVar20._0_2_ = ((Am_RGB_Value *)(puVar21 + -2))->red;
    uVar20._2_2_ = ((Am_RGB_Value *)(puVar21 + -2))->green;
    auVar24 = psllw(ZEXT416(uVar20),8);
    *(int *)((long)&pXVar10->red + lVar16) = auVar24._0_4_;
    *(unsigned_short *)((long)&pXVar10->blue + lVar16) = *puVar21 << 8;
    Am_Drawonable_Impl::Allocate_Closest_Color(draw,(XColor *)((long)&pXVar10->pixel + lVar16));
    lVar23 = lVar23 + 1;
    uVar14 = (ulong)(uint)*n_cols;
    lVar16 = lVar16 + 0x10;
    puVar21 = puVar21 + 3;
  }
  pAVar6 = this->image_;
  uVar2 = (pAVar6->iminfo).width;
  uVar18 = (ulong)uVar2;
  uVar3 = (pAVar6->iminfo).height;
  puVar22 = pAVar6->imdata;
  pSVar7 = draw->screen;
  uVar20 = pSVar7->depth;
  pDVar8 = pSVar7->display;
  uVar9 = *(undefined8 *)(*(long *)(pDVar8 + 0xe8) + 0x40 + (long)pSVar7->screen_number * 0x80);
  uVar15 = (uint)uVar2;
  if (uVar20 == 1) {
    uVar20 = uVar2 + 7 >> 3;
    uVar14 = 0;
    pvVar11 = malloc((ulong)(uVar20 * uVar3));
    pXVar10 = *cols;
    for (uVar17 = 0; uVar17 != uVar3; uVar17 = uVar17 + 1) {
      lVar16 = uVar17 * uVar20;
      for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
        if (pXVar10[puVar22[uVar19]].pixel == 0) {
          pbVar1 = (byte *)((long)pvVar11 + (uVar19 >> 3 & 0x1fffffff) + lVar16);
          *pbVar1 = *pbVar1 & ~Make_Pixmap_From_Generic_Image::byte_array[(uint)uVar19 & 7];
        }
        else {
          pbVar1 = (byte *)((long)pvVar11 + (uVar19 >> 3 & 0x1fffffff) + lVar16);
          *pbVar1 = *pbVar1 | Make_Pixmap_From_Generic_Image::byte_array[(uint)uVar19 & 7];
        }
      }
      puVar22 = puVar22 + uVar18;
    }
    uVar20 = 1;
  }
  else if ((int)uVar20 < 9) {
    uVar14 = 0;
    pvVar11 = malloc(uVar18 * uVar3);
    pXVar10 = *cols;
    for (uVar18 = 0; uVar3 * uVar15 != uVar18; uVar18 = uVar18 + 1) {
      *(char *)((long)pvVar11 + uVar18) = (char)pXVar10[puVar22[uVar18]].pixel;
    }
  }
  else if (uVar20 < 0x11) {
    uVar14 = 0;
    pvVar11 = malloc((ulong)((uint)uVar3 * (uint)uVar2 * 2));
    pXVar10 = *cols;
    for (uVar18 = 0; uVar3 * uVar15 != uVar18; uVar18 = uVar18 + 1) {
      *(short *)((long)pvVar11 + uVar18 * 2) = (short)pXVar10[puVar22[uVar18]].pixel;
    }
  }
  else {
    uVar14 = 0;
    pvVar11 = malloc((ulong)((uint)uVar3 * (uint)uVar2 * 4));
    pXVar10 = *cols;
    for (uVar18 = 0; uVar3 * uVar15 != uVar18; uVar18 = uVar18 + 1) {
      *(int *)((long)pvVar11 + uVar18 * 4) = (int)pXVar10[puVar22[uVar18]].pixel;
    }
  }
  puVar12 = (undefined4 *)
            XCreateImage(pDVar8,uVar9,uVar20,2,0,pvVar11,CONCAT44(uVar25,uVar15),
                         CONCAT44(uVar26,(uint)uVar3),CONCAT44(uVar27,8),uVar14 & 0xffffffff00000000
                        );
  PVar13 = XCreatePixmap(draw->screen->display,draw->xlib_drawable,*puVar12,puVar12[1],puVar12[10]);
  Am_Drawonable_Impl::set_gc_using_fill(draw,&Am_No_Style,Am_DRAW_COPY,0);
  XSetClipMask(draw->screen->display,draw->screen->gc,0);
  XPutImage(draw->screen->display,PVar13,draw->screen->gc,puVar12,0,0,0,0,*puVar12,puVar12[1]);
  (*(draw->super_Am_Drawonable)._vptr_Am_Drawonable[0x1e])(draw,draw->screen->clip_region);
  (**(code **)(puVar12 + 0x18))(puVar12);
  return PVar13;
}

Assistant:

Pixmap
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image(
    const Am_Drawonable_Impl *draw, XColor *&cols, int &n_cols)
{
  // Make a copy of the image data, and adjust colors in the image
  // to the ones we have in the X colormap.
  Am_RGB_Value *ctbl;
  n_cols = image_->Get_Color_Map(ctbl);
  cols = new XColor[n_cols];

  int i;
  // first, allocate all the closest colors.  Could be optimized a lot!
  for (i = 0; i < n_cols; i++) {
    cols[i].red = ctbl[i].red * 256;
    cols[i].green = ctbl[i].green * 256;
    cols[i].blue = ctbl[i].blue * 256;
    draw->Allocate_Closest_Color(cols[i]);
  }

  // Next, set the pixels in the image correctly.
  unsigned short width, height;
  image_->Get_Size(width, height);
  unsigned char *gif_image = image_->Get_Data();

  int depth = draw->screen->depth;
  Visual *visual =
      DefaultVisual(draw->screen->display, draw->screen->screen_number);

  unsigned char *x_image;

  // assume that pixels are packed into even byte boundaries
  if (depth == 1) {
    static unsigned char byte_array[] = {0x80, 0x40, 0x20, 0x10,
                                         0x08, 0x04, 0x02, 0x01};
    // X uses free() so we must use malloc.  (so says sentinel)
    int byte_width = (width + 7) / 8;
    x_image = (unsigned char *)malloc(byte_width * height);
    int i, j;
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        if (cols[gif_image[i * width + j]].pixel)
          x_image[i * byte_width + (j / 8)] |= byte_array[j % 8];
        else
          x_image[i * byte_width + (j / 8)] &= ~byte_array[j % 8];
      }
    }
  } else if (depth <= 8) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height);
    for (i = 0; i < (width * height); i++)
      x_image[i] = (unsigned char)(cols[gif_image[i]].pixel);
  } else if (depth <= 16) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 2);
    unsigned short *x_image_16 = (unsigned short *)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_16[i] = (unsigned short)(cols[gif_image[i]].pixel);
  } else {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 4);
    uint32_t *x_image_32 = (uint32_t*)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_32[i] = (uint32_t)(cols[gif_image[i]].pixel);
  }

  XImage *image = XCreateImage(draw->screen->display, visual, depth, ZPixmap,
                               0 /* offset */, (char *)x_image, width, height,
                               8 /* bitmap_pad */,
                               0 /* (X will calculate) bytes per line */);

  Pixmap pix = XCreatePixmap(draw->screen->display, draw->xlib_drawable,
                             image->width, image->height, image->depth);
  draw->set_gc_using_fill(Am_No_Style, Am_DRAW_COPY);
  // Clear the clip region; restore it later.
  XSetClipMask(draw->screen->display, draw->screen->gc, None);
  XPutImage(draw->screen->display, pix, draw->screen->gc, image, 0, 0, 0, 0,
            image->width, image->height);
  ((Am_Drawonable_Impl *)draw)->Set_Clip(draw->screen->clip_region);

  XDestroyImage(image);

  return pix;
}